

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_scroll.cpp
# Opt level: O2

void SetScroller(int tag,EScroll type,double dx,double dy)

{
  bool bVar1;
  DThinker *pDVar2;
  DScroller *this;
  int iVar3;
  FSectorTagIterator itr;
  TThinkerIterator<DScroller> iterator;
  
  TThinkerIterator<DScroller>::TThinkerIterator
            ((TThinkerIterator<DScroller> *)&iterator.super_FThinkerIterator,0x20);
  iVar3 = 0;
  while( true ) {
    pDVar2 = FThinkerIterator::Next(&iterator.super_FThinkerIterator,false);
    if (pDVar2 == (DThinker *)0x0) break;
    if (*(EScroll *)&pDVar2[1].super_DObject._vptr_DObject == type) {
      bVar1 = FTagManager::SectorHasTag(&tagManager,*(int *)&pDVar2[1].super_DObject.GCNext,tag);
      if (bVar1) {
        iVar3 = iVar3 + 1;
        pDVar2[1].super_DObject.Class = (PClass *)dx;
        pDVar2[1].super_DObject.ObjNext = (DObject *)dy;
      }
    }
  }
  if ((iVar3 == 0) && ((((dx != 0.0 || (NAN(dx))) || (dy != 0.0)) || (NAN(dy))))) {
    if (tag == 0) {
      itr.start = 0;
    }
    else {
      itr.start = tagManager.TagHashFirst[(ulong)(uint)tag & 0xff];
    }
    itr.searchtag = tag;
    while( true ) {
      iVar3 = FSectorTagIterator::Next(&itr);
      if (iVar3 < 0) break;
      this = (DScroller *)DObject::operator_new(0x90);
      DScroller::DScroller(this,type,dx,dy,-1,iVar3,0,scw_all);
    }
  }
  return;
}

Assistant:

void SetScroller (int tag, EScroll type, double dx, double dy)
{
	TThinkerIterator<DScroller> iterator (STAT_SCROLLER);
	DScroller *scroller;
	int i;

	// Check if there is already a scroller for this tag
	// If at least one sector with this tag is scrolling, then they all are.
	// If the deltas are both 0, we don't remove the scroller, because a
	// displacement/accelerative scroller might have been set up, and there's
	// no way to create one after the level is fully loaded.
	i = 0;
	while ( (scroller = iterator.Next ()) )
	{
		if (scroller->IsType (type))
		{
			if (tagManager.SectorHasTag(scroller->GetAffectee (), tag))
			{
				i++;
				scroller->SetRate (dx, dy);
			}
		}
	}

	if (i > 0 || (dx == 0 && dy == 0))
	{
		return;
	}

	// Need to create scrollers for the sector(s)
	FSectorTagIterator itr(tag);
	while ((i = itr.Next()) >= 0)
	{
		new DScroller (type, dx, dy, -1, i, 0);
	}
}